

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall SPTest_MultipleRealizations_Test::TestBody(SPTest_MultipleRealizations_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ExprBase EVar4;
  ExprBase EVar5;
  RandomVector *pRVar6;
  CallExprBuilder CVar7;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  SPAdapter sp;
  CallExprBuilder random;
  TestBasicProblem p;
  undefined4 in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  ExprBase in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff88c;
  ExprBase in_stack_fffffffffffff890;
  char *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff8a4;
  undefined8 in_stack_fffffffffffff8a8;
  Type TVar9;
  TestProblem *in_stack_fffffffffffff8b0;
  TestProblem *in_stack_fffffffffffff8c0;
  AssertHelper *in_stack_fffffffffffff900;
  AssertionResult local_6e8 [2];
  int local_6c8;
  undefined4 local_6c4;
  AssertionResult local_6c0 [2];
  size_t local_6a0;
  undefined4 local_694;
  AssertionResult local_690 [4];
  int in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  TestBasicProblem *in_stack_fffffffffffff9c0;
  ColProblem *in_stack_fffffffffffff9d8;
  SPAdapter *in_stack_fffffffffffff9e0;
  Impl *message;
  
  TVar9 = (Type)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
  TestBasicProblem::TestBasicProblem
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8);
  CVar7 = TestProblem::BeginRandom(in_stack_fffffffffffff8b0,TVar9);
  message = CVar7.impl_;
  mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
             (Reference)in_stack_fffffffffffff890.impl_,
             (type_conflict1)((ulong)in_stack_fffffffffffff880.impl_ >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
            ((BasicIteratedExprBuilder<mp::CallExpr> *)
             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
             (Arg)in_stack_fffffffffffff880.impl_);
  mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
             (double)in_stack_fffffffffffff880.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
             (NumericConstant)in_stack_fffffffffffff890.impl_,
             (type_conflict1)((ulong)in_stack_fffffffffffff880.impl_ >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
            ((BasicIteratedExprBuilder<mp::CallExpr> *)
             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
             (Arg)in_stack_fffffffffffff880.impl_);
  EVar4.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                                  ((BasicExprFactory<std::allocator<char>_> *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                                   (double)in_stack_fffffffffffff880.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
             (NumericConstant)in_stack_fffffffffffff890.impl_,
             (type_conflict1)((ulong)in_stack_fffffffffffff880.impl_ >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
            ((BasicIteratedExprBuilder<mp::CallExpr> *)
             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
             (Arg)in_stack_fffffffffffff880.impl_);
  EVar5.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                                  ((BasicExprFactory<std::allocator<char>_> *)
                                   CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                                   (double)in_stack_fffffffffffff880.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
             (NumericConstant)in_stack_fffffffffffff890.impl_,
             (type_conflict1)((ulong)in_stack_fffffffffffff880.impl_ >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
            ((BasicIteratedExprBuilder<mp::CallExpr> *)
             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
             (Arg)in_stack_fffffffffffff880.impl_);
  CVar7._8_8_ = EVar4.impl_;
  CVar7.impl_ = (Impl *)EVar5.impl_;
  TestProblem::EndRandom(in_stack_fffffffffffff8c0,CVar7);
  mp::SPAdapter::SPAdapter(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  local_694 = 1;
  local_6a0 = mp::SPAdapter::num_rvs((SPAdapter *)0x116769);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            (in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
             (unsigned_long *)in_stack_fffffffffffff880.impl_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_690);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    in_stack_fffffffffffff8b0 =
         (TestProblem *)testing::AssertionResult::failure_message((AssertionResult *)0x116833);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,TVar9,
               (char *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
               (int)((ulong)in_stack_fffffffffffff898 >> 0x20),
               (char *)in_stack_fffffffffffff890.impl_);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff900,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880.impl_);
    testing::Message::~Message((Message *)0x116890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1168e8);
  local_6c4 = 3;
  pRVar6 = mp::SPAdapter::rv((SPAdapter *)in_stack_fffffffffffff880.impl_,in_stack_fffffffffffff87c)
  ;
  TVar9 = (Type)((ulong)pRVar6 >> 0x20);
  iVar2 = mp::SPAdapter::RandomVector::num_realizations((RandomVector *)0x116913);
  local_6c8 = iVar2;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
             (int *)in_stack_fffffffffffff880.impl_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6c0);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    in_stack_fffffffffffff898 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1169ba);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,TVar9,(char *)CONCAT44(iVar2,uVar8),
               (int)((ulong)in_stack_fffffffffffff898 >> 0x20),
               (char *)in_stack_fffffffffffff890.impl_);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff900,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880.impl_);
    testing::Message::~Message((Message *)0x116a17);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x116a6f);
  pRVar6 = mp::SPAdapter::rv((SPAdapter *)in_stack_fffffffffffff880.impl_,in_stack_fffffffffffff87c)
  ;
  iVar3 = mp::SPAdapter::RandomVector::num_elements(pRVar6);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff898,(char *)pRVar6,
             (int *)CONCAT44(iVar3,in_stack_fffffffffffff888),(int *)in_stack_fffffffffffff880.impl_
            );
  iVar3 = (int)((ulong)in_stack_fffffffffffff898 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    in_stack_fffffffffffff880.impl_ =
         (Impl *)testing::AssertionResult::failure_message((AssertionResult *)0x116b41);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,TVar9,(char *)CONCAT44(iVar2,uVar8),iVar3,
               (char *)pRVar6);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff900,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880.impl_);
    testing::Message::~Message((Message *)0x116b9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x116bf3);
  mp::SPAdapter::~SPAdapter((SPAdapter *)in_stack_fffffffffffff880.impl_);
  TestBasicProblem::~TestBasicProblem((TestBasicProblem *)0x116c0d);
  return;
}

Assistant:

TEST(SPTest, MultipleRealizations) {
  TestBasicProblem p(2);
  auto random = p.BeginRandom(4);
  random.AddArg(p.MakeVariable(0));
  random.AddArg(p.MakeNumericConstant(11));
  random.AddArg(p.MakeNumericConstant(22));
  random.AddArg(p.MakeNumericConstant(33));
  p.EndRandom(random);
  mp::SPAdapter sp(p);
  EXPECT_EQ(1, sp.num_rvs());
  EXPECT_EQ(3, sp.rv(0).num_realizations());
  EXPECT_EQ(1, sp.rv(0).num_elements());
}